

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

uint32 __thiscall Js::RecyclableObjectWalker::GetChildrenCount(RecyclableObjectWalker *this)

{
  Type TVar1;
  JavascriptRegExpConstructor *this_00;
  HostDebugContext *pHVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ArenaAllocator *pAVar11;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar12;
  JavascriptRegExpConstructor *instance;
  undefined4 *puVar13;
  Type *pTVar14;
  JavascriptString *propertyString;
  Var pvVar15;
  undefined4 extraout_var;
  PropertyId *pPVar16;
  ScriptContext *pSVar17;
  RecyclableObject *pRVar18;
  ScriptContext *this_01;
  RecyclableArgumentsArrayWalker *this_02;
  JavascriptPromise *_instance;
  DynamicObject *pDVar19;
  ArrayObject *instance_00;
  RecyclableArrayWalker *this_03;
  GlobalObject *pGVar20;
  DebugContext *pDVar21;
  JavascriptLibrary *pJVar22;
  Var instance_01;
  undefined *puVar23;
  uint uVar24;
  JavascriptEnumerator *pJVar25;
  ulong uVar26;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_04;
  TypeId typeId;
  ulong uVar27;
  Type TVar28;
  undefined1 local_d8 [8];
  JavascriptStaticEnumerator enumerator;
  uint local_74;
  PropertyRecord *pPStack_70;
  uint32 indexVal;
  Var varValue;
  undefined4 local_5c;
  RecyclableObjectWalker *local_58;
  ulong local_50;
  RecyclableMethodsGroupWalker *local_48;
  RecyclableMethodsGroupWalker *pMethodsGroupWalker;
  uint local_38;
  undefined4 local_34;
  PropertyId propertyId;
  
  pLVar12 = this->pMembersList;
  if (pLVar12 !=
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) goto LAB_007ed1ba;
  pAVar11 = GetArenaFromContext(this->scriptContext);
  pLVar12 = JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::New(pAVar11,4);
  this->pMembersList = pLVar12;
  local_48 = (RecyclableMethodsGroupWalker *)0x0;
  bVar4 = VarIs<Js::RecyclableObject>(this->instance);
  if (bVar4) {
    instance = (JavascriptRegExpConstructor *)VarTo<Js::RecyclableObject>(this->instance);
    pMethodsGroupWalker = (RecyclableMethodsGroupWalker *)instance;
    if (this->originalInstance != (Var)0x0) {
      pMethodsGroupWalker =
           (RecyclableMethodsGroupWalker *)VarTo<Js::RecyclableObject>(this->originalInstance);
    }
    pvVar15 = this->instance;
    if (pvVar15 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_007ed24d;
      *puVar13 = 0;
    }
    uVar27 = 4;
    bVar4 = TaggedInt::Is(pvVar15);
    if (bVar4) {
      uVar27 = 3;
    }
    else if ((ulong)pvVar15 >> 0x32 == 0) {
      pRVar18 = UnsafeVarTo<Js::RecyclableObject>(pvVar15);
      if (pRVar18 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar13 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_007ed24d;
        *puVar13 = 0;
      }
      TVar1 = ((pRVar18->type).ptr)->typeId;
      uVar27 = (ulong)TVar1;
      if ((0x57 < (int)TVar1) && (BVar6 = RecyclableObject::IsExternal(pRVar18), BVar6 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar13 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) goto LAB_007ed24d;
        *puVar13 = 0;
      }
    }
    BVar6 = JavascriptOperators::IsObject((RecyclableObject *)instance);
    if (BVar6 != 0) {
      BVar6 = RecyclableObject::IsExternal((RecyclableObject *)instance);
      varValue = pAVar11;
      if (BVar6 == 0) {
        if (instance == (JavascriptRegExpConstructor *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar13 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_007ed24d;
          *puVar13 = 0;
        }
        pTVar14 = (instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                  super_RecyclableObject.type.ptr;
        if ((int)pTVar14->typeId < 0x58) {
          if (pTVar14->typeId == TypeIds_Proxy) goto LAB_007ec6c5;
        }
        else {
          BVar6 = RecyclableObject::IsExternal((RecyclableObject *)instance);
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar13 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) goto LAB_007ed24d;
            *puVar13 = 0;
          }
        }
        TVar1 = ((instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                 super_RecyclableObject.type.ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          local_50 = uVar27;
          if (TVar1 != TypeIds_UnscopablesWrapperObject) goto LAB_007ec96c;
          pvVar15 = JavascriptOperators::OP_UnwrapWithObj(instance);
          instance = (JavascriptRegExpConstructor *)UnsafeVarTo<Js::RecyclableObject>(pvVar15);
          local_34 = (undefined4)CONCAT71((int7)((ulong)instance >> 8),1);
        }
        else {
          local_50 = uVar27;
          BVar6 = RecyclableObject::IsExternal((RecyclableObject *)instance);
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar13 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) goto LAB_007ed24d;
            *puVar13 = 0;
          }
LAB_007ec96c:
          local_34 = 0;
        }
        uVar8 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[10])(instance);
        uVar24 = 0;
        if ((int)uVar8 < 1) {
          uVar8 = 0;
          uVar24 = 0;
        }
        for (; uVar8 != uVar24; uVar24 = uVar24 + 1) {
          iVar7 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(instance,(ulong)(uVar24 & 0xffff));
          if ((char)local_34 == '\0') {
            bVar4 = false;
          }
          else {
            BVar6 = JavascriptOperators::IsPropertyUnscopable(instance,iVar7);
            bVar4 = BVar6 != 0;
          }
          if (iVar7 - 0x10U < 0xffffffef) {
            InsertItem(this,(RecyclableObject *)pMethodsGroupWalker,(RecyclableObject *)instance,
                       iVar7,false,bVar4,&local_48,false);
          }
        }
        local_58 = this;
        if (DAT_0143bfab != '\0') {
          uVar24 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                     super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject[0x40])(instance);
          iVar7 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x41])(instance);
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          pJVar25 = (JavascriptEnumerator *)0x0;
          if ((int)uVar24 < 1) {
            uVar24 = 0;
          }
          enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)(ulong)uVar24;
          for (; enumerator.arrayEnumerator.ptr != pJVar25;
              pJVar25 = (JavascriptEnumerator *)
                        ((long)&(pJVar25->super_RecyclableObject).super_FinalizableObject.
                                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1)) {
            iVar10 = *(int *)(CONCAT44(extraout_var,iVar7) + (long)pJVar25 * 4);
            local_d8._0_4_ = iVar10;
            if ((char)local_34 == '\0') {
              local_5c = 0;
            }
            else {
              BVar6 = JavascriptOperators::IsPropertyUnscopable(instance,iVar10);
              local_5c = CONCAT31((int3)((uint)BVar6 >> 8),BVar6 != 0);
            }
            if (iVar10 != -1) {
              bVar4 = true;
              if (iVar10 == 0xd1) {
                bVar4 = JavascriptArray::IsNonES5Array(instance);
                bVar4 = !bVar4;
              }
              bVar5 = VarIsImpl<Js::BoundFunction>((RecyclableObject *)instance);
              pLVar12 = local_58->pMembersList;
              if ((!bVar5) ||
                 (bVar5 = JsUtil::
                          ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
                          ::Any<Js::RecyclableObjectWalker::GetChildrenCount()::__0>
                                    ((ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
                                      *)pLVar12,(anon_class_8_1_66460f8e)local_d8), !bVar5)) {
                bVar5 = JsUtil::
                        ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
                        ::Any<Js::RecyclableObjectWalker::GetChildrenCount()::__0>
                                  ((ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
                                    *)pLVar12,(anon_class_8_1_66460f8e)local_d8);
                if (bVar5) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar13 = 1;
                  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                              ,0x9ec,"(!this->pMembersList->Any(containsPredicate))"
                                              ,
                                              "Special property already on the object, no need to insert."
                                             );
                  if (!bVar5) goto LAB_007ed24d;
                  *puVar13 = 0;
                }
                InsertItem(local_58,(RecyclableObject *)pMethodsGroupWalker,
                           (RecyclableObject *)instance,iVar10,bVar4,local_5c._0_1_,&local_48,false)
                ;
              }
            }
          }
          bVar4 = VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)instance);
          if ((bVar4) &&
             (this_00 = (((local_58->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        super_JavascriptLibraryBase).regexConstructor.ptr, this_00 == instance)) {
            uVar9 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyCount(this_00);
            pPVar16 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyIds(this_00);
            uVar26 = 0;
            uVar27 = (ulong)uVar9;
            if ((int)uVar9 < 1) {
              uVar27 = uVar26;
            }
            for (; uVar27 != uVar26; uVar26 = uVar26 + 1) {
              InsertItem(local_58,(RecyclableObject *)pMethodsGroupWalker,
                         (RecyclableObject *)instance,pPVar16[uVar26],true,false,&local_48,false);
            }
          }
        }
        pRVar18 = RecyclableObject::GetPrototype((RecyclableObject *)instance);
        this = local_58;
        pAVar11 = (ArenaAllocator *)varValue;
        if (pRVar18 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar13 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_007ed24d;
          *puVar13 = 0;
        }
        TVar1 = ((pRVar18->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          typeId = (TypeId)local_50;
          if (TVar1 == TypeIds_Null) goto LAB_007eceee;
        }
        else {
          BVar6 = RecyclableObject::IsExternal(pRVar18);
          typeId = (TypeId)local_50;
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar13 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) goto LAB_007ed24d;
            *puVar13 = 0;
          }
        }
        EnsureFakeGroupObjectWalkerList(this);
        this_01 = (ScriptContext *)new<Memory::ArenaAllocator>(0x38,pAVar11,0x35916e);
        pSVar17 = this->scriptContext;
        instance_01 = this->instance;
        pvVar15 = this->originalInstance;
LAB_007eced3:
        RecyclableProtoObjectWalker::RecyclableProtoObjectWalker
                  ((RecyclableProtoObjectWalker *)this_01,pSVar17,instance_01,pvVar15);
        local_d8 = (undefined1  [8])this_01;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)local_d8);
      }
      else {
        pTVar14 = (instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                  super_RecyclableObject.type.ptr;
LAB_007ec6c5:
        pSVar17 = (((pTVar14->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                  ptr;
        JavascriptStaticEnumerator::JavascriptStaticEnumerator
                  ((JavascriptStaticEnumerator *)local_d8);
        iVar7 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x2b])(instance,local_d8,3,pSVar17);
        if (iVar7 != 0) {
          local_50 = uVar27;
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          while (propertyString =
                      JavascriptStaticEnumerator::MoveAndGetNext
                                ((JavascriptStaticEnumerator *)local_d8,(PropertyId *)&local_38,
                                 (PropertyAttributes *)0x0), uVar27 = local_50,
                propertyString != (JavascriptString *)0x0) {
            if (local_38 == 0xffffffff) {
              ScriptContext::GetOrAddPropertyRecord(pSVar17,propertyString,&stack0xffffffffffffff90)
              ;
              local_38 = pPStack_70->pid;
            }
            if (local_38 < 0x10) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar13 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                          ,0x987,"(!Js::IsInternalPropertyId(propertyId))",
                                          "!Js::IsInternalPropertyId(propertyId)");
              if (!bVar4) goto LAB_007ed24d;
              *puVar13 = 0;
            }
            BVar6 = ScriptContext::IsNumericPropertyId(pSVar17,local_38,&local_74);
            if ((BVar6 == 0) ||
               (iVar7 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.
                          super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x26])
                                  (instance,instance,(ulong)local_74), iVar7 != 1)) {
              InsertItem(this,(RecyclableObject *)pMethodsGroupWalker,(RecyclableObject *)instance,
                         local_38,false,false,&local_48,true);
            }
            else {
              InsertItem(this,local_38,false,false,pPStack_70,&local_48,true);
            }
          }
        }
        pAVar11 = (ArenaAllocator *)varValue;
        typeId = (TypeId)uVar27;
        if (typeId == TypeIds_Proxy) {
          EnsureFakeGroupObjectWalkerList(this);
          pMethodsGroupWalker =
               (RecyclableMethodsGroupWalker *)
               VarTo<Js::JavascriptProxy,Js::RecyclableObject>((RecyclableObject *)instance);
          pSVar17 = (ScriptContext *)new<Memory::ArenaAllocator>(0x38,pAVar11,0x35916e);
          RecyclableProxyObjectWalker::RecyclableProxyObjectWalker
                    ((RecyclableProxyObjectWalker *)pSVar17,this->scriptContext,pMethodsGroupWalker)
          ;
          local_d8 = (undefined1  [8])pSVar17;
          JsUtil::
          List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)local_d8);
        }
        pRVar18 = RecyclableObject::GetPrototype((RecyclableObject *)instance);
        if (pRVar18 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar13 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_007ed24d;
          *puVar13 = 0;
          pAVar11 = (ArenaAllocator *)varValue;
        }
        TVar1 = ((pRVar18->type).ptr)->typeId;
        if (0x57 < (int)TVar1) {
          BVar6 = RecyclableObject::IsExternal(pRVar18);
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar13 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) goto LAB_007ed24d;
            *puVar13 = 0;
          }
LAB_007ecea1:
          EnsureFakeGroupObjectWalkerList(this);
          this_01 = (ScriptContext *)new<Memory::ArenaAllocator>(0x38,pAVar11,0x35916e);
          pSVar17 = this->scriptContext;
          instance_01 = this->instance;
          pvVar15 = this->originalInstance;
          if (this->originalInstance == (Var)0x0) {
            pvVar15 = instance_01;
          }
          goto LAB_007eced3;
        }
        if (TVar1 != TypeIds_Null) goto LAB_007ecea1;
      }
LAB_007eceee:
      switch(typeId) {
      case TypeIds_Map:
        EnsureFakeGroupObjectWalkerList(this);
        pGVar20 = (GlobalObject *)
                  VarTo<Js::JavascriptMap,Js::RecyclableObject>((RecyclableObject *)instance);
        local_d8 = (undefined1  [8])new<Memory::ArenaAllocator>(0x20,pAVar11,0x35916e);
        pJVar22 = (JavascriptLibrary *)this->scriptContext;
        puVar23 = &RecyclableCollectionObjectWalker<Js::JavascriptMap>::vtable;
        break;
      case TypeIds_Set:
        EnsureFakeGroupObjectWalkerList(this);
        pGVar20 = (GlobalObject *)
                  VarTo<Js::JavascriptSet,Js::RecyclableObject>((RecyclableObject *)instance);
        local_d8 = (undefined1  [8])new<Memory::ArenaAllocator>(0x20,pAVar11,0x35916e);
        pJVar22 = (JavascriptLibrary *)this->scriptContext;
        puVar23 = &RecyclableCollectionObjectWalker<Js::JavascriptSet>::vtable;
        break;
      case TypeIds_WeakMap:
        EnsureFakeGroupObjectWalkerList(this);
        pGVar20 = (GlobalObject *)
                  VarTo<Js::JavascriptWeakMap,Js::RecyclableObject>((RecyclableObject *)instance);
        local_d8 = (undefined1  [8])new<Memory::ArenaAllocator>(0x20,pAVar11,0x35916e);
        pJVar22 = (JavascriptLibrary *)this->scriptContext;
        puVar23 = &RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::vtable;
        break;
      case TypeIds_WeakSet:
        EnsureFakeGroupObjectWalkerList(this);
        pGVar20 = (GlobalObject *)
                  VarTo<Js::JavascriptWeakSet,Js::RecyclableObject>((RecyclableObject *)instance);
        local_d8 = (undefined1  [8])new<Memory::ArenaAllocator>(0x20,pAVar11,0x35916e);
        pJVar22 = (JavascriptLibrary *)this->scriptContext;
        puVar23 = &RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::vtable;
        break;
      default:
        if (typeId != TypeIds_Promise) {
          if (typeId == TypeIds_Arguments) {
            pDVar19 = (DynamicObject *)this->instance;
            if (pDVar19 == (DynamicObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar13 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                          ,0xa19,"(argObj)","argObj");
              if (!bVar4) {
LAB_007ed24d:
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *puVar13 = 0;
            }
            iVar7 = (*(pDVar19->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])(pDVar19);
            if ((iVar7 != 0) || (bVar4 = DynamicObject::HasNonEmptyObjectArray(pDVar19), bVar4)) {
              this_02 = (RecyclableArgumentsArrayWalker *)
                        new<Memory::ArenaAllocator>(0x58,pAVar11,0x35916e);
              RecyclableArgumentsArrayWalker::RecyclableArgumentsArrayWalker
                        (this_02,this->scriptContext,this->instance,this->originalInstance);
              this->innerArrayObjectWalker = (RecyclableArrayWalker *)this_02;
            }
          }
          else {
            bVar4 = DynamicType::Is(typeId);
            if (bVar4) {
              pDVar19 = VarTo<Js::DynamicObject>(this->instance);
              bVar4 = DynamicObject::HasNonEmptyObjectArray(pDVar19);
              if (bVar4) {
                instance_00 = DynamicObject::GetObjectArray(pDVar19);
                bVar4 = VarIsImpl<Js::ES5Array>((RecyclableObject *)instance_00);
                if (bVar4) {
                  this_03 = (RecyclableArrayWalker *)
                            new<Memory::ArenaAllocator>(0x50,pAVar11,0x35916e);
                  RecyclableES5ArrayWalker::RecyclableES5ArrayWalker
                            ((RecyclableES5ArrayWalker *)this_03,this->scriptContext,instance_00,
                             this->originalInstance);
                }
                else {
                  bVar4 = JavascriptArray::IsNonES5Array(instance_00);
                  this_03 = (RecyclableArrayWalker *)
                            new<Memory::ArenaAllocator>(0x50,pAVar11,0x35916e);
                  if (bVar4) {
                    RecyclableArrayWalker::RecyclableArrayWalker
                              (this_03,this->scriptContext,instance_00,this->originalInstance);
                  }
                  else {
                    RecyclableTypedArrayWalker::RecyclableTypedArrayWalker
                              ((RecyclableTypedArrayWalker *)this_03,this->scriptContext,instance_00
                               ,this->originalInstance);
                  }
                }
                this->innerArrayObjectWalker = this_03;
                this_03->fOnlyOwnProperties = true;
              }
            }
          }
          goto LAB_007ed188;
        }
        EnsureFakeGroupObjectWalkerList(this);
        _instance = VarTo<Js::JavascriptPromise,Js::RecyclableObject>((RecyclableObject *)instance);
        pSVar17 = (ScriptContext *)new<Memory::ArenaAllocator>(0x38,pAVar11,0x35916e);
        RecyclablePromiseObjectWalker::RecyclablePromiseObjectWalker
                  ((RecyclablePromiseObjectWalker *)pSVar17,this->scriptContext,_instance);
        this_04 = this->fakeGroupObjectWalkerList;
        local_d8 = (undefined1  [8])pSVar17;
        goto LAB_007ed183;
      }
      (((RecyclableObjectWalker *)&((ScriptContext *)local_d8)->super_ScriptContextInfo)->
      super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
           (_func_int **)(puVar23 + 0x10);
      (((ScriptContext *)local_d8)->super_ScriptContextBase).javascriptLibrary = pJVar22;
      (((ScriptContext *)local_d8)->super_ScriptContextBase).globalObject = pGVar20;
      *(Var *)&(((ScriptContext *)local_d8)->super_ScriptContextBase).isClosed = (Var)0x0;
      this_04 = this->fakeGroupObjectWalkerList;
LAB_007ed183:
      JsUtil::
      List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(this_04,(IDiagObjectModelWalkerBase **)local_d8);
    }
LAB_007ed188:
    if (local_48 != (RecyclableMethodsGroupWalker *)0x0) {
      RecyclableMethodsGroupWalker::Sort(local_48);
    }
  }
  pDVar21 = ScriptContext::GetDebugContext(this->scriptContext);
  pHVar2 = pDVar21->hostDebugContext;
  if (pHVar2 != (HostDebugContext *)0x0) {
    (*pHVar2->_vptr_HostDebugContext[5])(pHVar2,this->pMembersList,this->scriptContext);
  }
  pLVar12 = this->pMembersList;
LAB_007ed1ba:
  iVar7 = (pLVar12->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  TVar28 = 0;
  iVar10 = 0;
  if (this->innerArrayObjectWalker != (RecyclableArrayWalker *)0x0) {
    iVar10 = (*(this->innerArrayObjectWalker->super_RecyclableObjectWalker).
               super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase[1])();
  }
  if (this->fakeGroupObjectWalkerList !=
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    TVar28 = (this->fakeGroupObjectWalkerList->
             super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
             ).count;
  }
  return iVar10 + iVar7 + TVar28;
}

Assistant:

uint32 RecyclableObjectWalker::GetChildrenCount()
    {
        if (pMembersList == nullptr)
        {
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);

            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena);

            RecyclableMethodsGroupWalker *pMethodsGroupWalker = nullptr;

            if (Js::VarIs<Js::RecyclableObject>(instance))
            {
                Js::RecyclableObject* object = Js::VarTo<Js::RecyclableObject>(instance);
                // If we are walking a prototype, we'll use its instance for property names enumeration, but originalInstance to get values
                Js::RecyclableObject* originalObject = (originalInstance != nullptr) ? Js::VarTo<Js::RecyclableObject>(originalInstance) : object;
                const Js::TypeId typeId = JavascriptOperators::GetTypeId(instance);

                if (JavascriptOperators::IsObject(object))
                {
                    if (object->IsExternal() || JavascriptOperators::GetTypeId(object) == TypeIds_Proxy)
                    {
                        try
                        {
                            ScriptContext * objectContext = object->GetScriptContext();
                            JavascriptStaticEnumerator enumerator;
                            if (object->GetEnumerator(&enumerator, EnumeratorFlags::EnumNonEnumerable | EnumeratorFlags::EnumSymbols, objectContext))
                            {
                                Js::PropertyId propertyId;
                                JavascriptString * obj;

                                while ((obj = enumerator.MoveAndGetNext(propertyId)) != nullptr)
                                {
                                    if (propertyId == Constants::NoProperty)
                                    {
                                        const PropertyRecord* propertyRecord;
                                        objectContext->GetOrAddPropertyRecord(obj, &propertyRecord);
                                        propertyId = propertyRecord->GetPropertyId();
                                    }
                                    // MoveAndGetNext shouldn't return an internal property id
                                    Assert(!Js::IsInternalPropertyId(propertyId));

                                    uint32 indexVal;
                                    Var varValue;
                                    if (objectContext->IsNumericPropertyId(propertyId, &indexVal) && object->GetItem(object, indexVal, &varValue, objectContext))
                                    {
                                        InsertItem(propertyId, false /*isConst*/, false /*isUnscoped*/, varValue, &pMethodsGroupWalker, true /*shouldPinProperty*/);
                                    }
                                    else
                                    {
                                        InsertItem(originalObject, object, propertyId, false /*isConst*/, false /*isUnscoped*/, &pMethodsGroupWalker, true /*shouldPinProperty*/);
                                    }
                                }
                            }
                        }
                        catch (const JavascriptException& err)
                        {
                            Var error = err.GetAndClear()->GetThrownObject(scriptContext);
                            if (error != nullptr && Js::VarIs<Js::JavascriptError>(error))
                            {
                                Js::PropertyId propertyId = scriptContext->GetOrAddPropertyIdTracked(_u("{error}"));
                                InsertItem(propertyId, false /*isConst*/, false /*isUnscoped*/, error, &pMethodsGroupWalker);
                            }
                        }

                        if (typeId == TypeIds_Proxy)
                        {
                            // Provide [Proxy] group object
                            EnsureFakeGroupObjectWalkerList();

                            JavascriptProxy* proxy = VarTo<JavascriptProxy>(object);
                            RecyclableProxyObjectWalker* proxyWalker = Anew(arena, RecyclableProxyObjectWalker, scriptContext, proxy);
                            fakeGroupObjectWalkerList->Add(proxyWalker);
                        }
                        // If current object has internal proto object then provide [prototype] group object.
                        if (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null)
                        {
                            // Has [prototype] object.
                            EnsureFakeGroupObjectWalkerList();

                            RecyclableProtoObjectWalker *pProtoWalker = Anew(arena, RecyclableProtoObjectWalker, scriptContext, instance, (originalInstance == nullptr) ? instance : originalInstance);
                            fakeGroupObjectWalkerList->Add(pProtoWalker);
                        }
                    }
                    else
                    {
                        RecyclableObject* wrapperObject = nullptr;
                        if (JavascriptOperators::GetTypeId(object) == TypeIds_UnscopablesWrapperObject)
                        {
                            wrapperObject = object;
                            object = Js::UnsafeVarTo<Js::RecyclableObject>(JavascriptOperators::OP_UnwrapWithObj(wrapperObject));
                        }

                        int count = object->GetPropertyCount();

                        for (int i = 0; i < count; i++)
                        {
                            Js::PropertyId propertyId = object->GetPropertyId((PropertyIndex)i);
                            bool isUnscoped = false;
                            if (wrapperObject && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
                            {
                                isUnscoped = true;
                            }
                            if (propertyId != Js::Constants::NoProperty && !Js::IsInternalPropertyId(propertyId))
                            {
                                InsertItem(originalObject, object, propertyId, false /*isConst*/, isUnscoped, &pMethodsGroupWalker);
                            }
                        }

                        if (CONFIG_FLAG(EnumerateSpecialPropertiesInDebugger))
                        {
                            count = object->GetSpecialPropertyCount();
                            PropertyId const * specialPropertyIds = object->GetSpecialPropertyIds();
                            for (int i = 0; i < count; i++)
                            {
                                Js::PropertyId propertyId = specialPropertyIds[i];
                                bool isUnscoped = false;
                                if (wrapperObject && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
                                {
                                    isUnscoped = true;
                                }
                                if (propertyId != Js::Constants::NoProperty)
                                {
                                    bool isConst = true;
                                    if (propertyId == PropertyIds::length && Js::JavascriptArray::IsNonES5Array(object))
                                    {
                                        // For JavascriptArrays, we allow resetting the length special property.
                                        isConst = false;
                                    }

                                    auto containsPredicate = [&](Js::DebuggerPropertyDisplayInfo* info) { return info->propId == propertyId; };
                                    if (Js::VarIs<Js::BoundFunction>(object)
                                        && this->pMembersList->Any(containsPredicate))
                                    {
                                        // Bound functions can already contain their special properties,
                                        // so we need to check for that (caller and arguments).  This occurs
                                        // when JavascriptFunction::EntryBind() is called.  Arguments can similarly
                                        // already display caller in compat mode 8.
                                        continue;
                                    }

                                    AssertMsg(!this->pMembersList->Any(containsPredicate), "Special property already on the object, no need to insert.");

                                    InsertItem(originalObject, object, propertyId, isConst, isUnscoped, &pMethodsGroupWalker);
                                }
                            }
                            if (Js::VarIs<Js::JavascriptFunction>(object))
                            {
                                // We need to special-case RegExp constructor here because it has some special properties (above) and some
                                // special enumerable properties which should all show up in the debugger.
                                JavascriptRegExpConstructor* regExp = scriptContext->GetLibrary()->GetRegExpConstructor();

                                if (regExp == object)
                                {
                                    bool isUnscoped = false;
                                    bool isConst = true;
                                    count = regExp->GetSpecialEnumerablePropertyCount();
                                    PropertyId const * specialEnumerablePropertyIds = regExp->GetSpecialEnumerablePropertyIds();

                                    for (int i = 0; i < count; i++)
                                    {
                                        Js::PropertyId propertyId = specialEnumerablePropertyIds[i];

                                        InsertItem(originalObject, object, propertyId, isConst, isUnscoped, &pMethodsGroupWalker);
                                    }
                                }
                            }
                        }

                        // If current object has internal proto object then provide [prototype] group object.
                        if (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null)
                        {
                            // Has [prototype] object.
                            EnsureFakeGroupObjectWalkerList();

                            RecyclableProtoObjectWalker *pProtoWalker = Anew(arena, RecyclableProtoObjectWalker, scriptContext, instance, originalInstance);
                            fakeGroupObjectWalkerList->Add(pProtoWalker);
                        }
                    }

                    // If the object contains array indices.
                    if (typeId == TypeIds_Arguments)
                    {
                        // Create ArgumentsArray walker for an arguments object

                        Js::ArgumentsObject * argObj = static_cast<Js::ArgumentsObject*>(instance);
                        Assert(argObj);

                        if (argObj->GetNumberOfArguments() > 0 || argObj->HasNonEmptyObjectArray())
                        {
                            innerArrayObjectWalker = Anew(arena, RecyclableArgumentsArrayWalker, scriptContext, (Var)instance, originalInstance);
                        }
                    }
                    else if (typeId == TypeIds_Map)
                    {
                        // Provide [Map] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptMap* map = VarTo<JavascriptMap>(object);
                        RecyclableMapObjectWalker *pMapWalker = Anew(arena, RecyclableMapObjectWalker, scriptContext, map);
                        fakeGroupObjectWalkerList->Add(pMapWalker);
                    }
                    else if (typeId == TypeIds_Set)
                    {
                        // Provide [Set] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptSet* set = VarTo<JavascriptSet>(object);
                        RecyclableSetObjectWalker *pSetWalker = Anew(arena, RecyclableSetObjectWalker, scriptContext, set);
                        fakeGroupObjectWalkerList->Add(pSetWalker);
                    }
                    else if (typeId == TypeIds_WeakMap)
                    {
                        // Provide [WeakMap] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptWeakMap* weakMap = VarTo<JavascriptWeakMap>(object);
                        RecyclableWeakMapObjectWalker *pWeakMapWalker = Anew(arena, RecyclableWeakMapObjectWalker, scriptContext, weakMap);
                        fakeGroupObjectWalkerList->Add(pWeakMapWalker);
                    }
                    else if (typeId == TypeIds_WeakSet)
                    {
                        // Provide [WeakSet] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptWeakSet* weakSet = VarTo<JavascriptWeakSet>(object);
                        RecyclableWeakSetObjectWalker *pWeakSetWalker = Anew(arena, RecyclableWeakSetObjectWalker, scriptContext, weakSet);
                        fakeGroupObjectWalkerList->Add(pWeakSetWalker);
                    }
                    else if (typeId == TypeIds_Promise)
                    {
                        // Provide [Promise] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptPromise* promise = VarTo<JavascriptPromise>(object);
                        RecyclablePromiseObjectWalker *pPromiseWalker = Anew(arena, RecyclablePromiseObjectWalker, scriptContext, promise);
                        fakeGroupObjectWalkerList->Add(pPromiseWalker);
                    }
                    else if (Js::DynamicType::Is(typeId))
                    {
                        DynamicObject *const dynamicObject = Js::VarTo<Js::DynamicObject>(instance);
                        if (dynamicObject->HasNonEmptyObjectArray())
                        {
                            ArrayObject* objectArray = dynamicObject->GetObjectArray();
                            if (Js::VarIs<Js::ES5Array>(objectArray))
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableES5ArrayWalker, scriptContext, objectArray, originalInstance);
                            }
                            else if (Js::JavascriptArray::IsNonES5Array(objectArray))
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableArrayWalker, scriptContext, objectArray, originalInstance);
                            }
                            else
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableTypedArrayWalker, scriptContext, objectArray, originalInstance);
                            }

                            innerArrayObjectWalker->SetOnlyWalkOwnProperties(true);
                        }
                    }
                }
            }
            // Sort the members of the methods group
            if (pMethodsGroupWalker)
            {
                pMethodsGroupWalker->Sort();
            }

            // Sort current pMembersList.
            HostDebugContext* hostDebugContext = scriptContext->GetDebugContext()->GetHostDebugContext();
            if (hostDebugContext != nullptr)
            {
                hostDebugContext->SortMembersList(pMembersList, scriptContext);
            }
        }

        uint32 childrenCount =
            pMembersList->Count()
          + (innerArrayObjectWalker ? innerArrayObjectWalker->GetChildrenCount() : 0)
          + (fakeGroupObjectWalkerList ? fakeGroupObjectWalkerList->Count() : 0);

        return childrenCount;
    }